

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int buffer_reserve(BUFFER *buf,size_t n)

{
  ulong uVar1;
  int iVar2;
  ulong alloc;
  long lVar3;
  ulong uVar4;
  
  uVar4 = n + buf->size;
  if (buf->alloc <= uVar4) {
    if (uVar4 < 0x101) {
      uVar1 = 0x10;
      do {
        alloc = uVar1;
        uVar1 = alloc * 2;
      } while (alloc < uVar4);
    }
    else {
      lVar3 = 0x200;
      do {
        alloc = lVar3 - 0x20;
        lVar3 = lVar3 * 2;
      } while (alloc < uVar4);
    }
    iVar2 = buffer_realloc(buf,alloc);
    return iVar2;
  }
  return 0;
}

Assistant:

int
buffer_reserve(BUFFER* buf, size_t n)
{
    size_t alloc;

    if(buf->size + n < buf->alloc)
        return 0;

    alloc = buf->size + n;
    alloc = buffer_good_alloc_size(alloc);

    return buffer_realloc(buf, alloc);
}